

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.h
# Opt level: O3

void __thiscall LineReader<true>::iterator::iterator(iterator *this,File *f,ssize_t offset)

{
  string local_40;
  
  this->f_ = f;
  this->offset_ = offset;
  (this->line)._M_dataplus._M_p = (pointer)&(this->line).field_2;
  (this->line)._M_string_length = 0;
  (this->line).field_2._M_local_buf[0] = '\0';
  if (-1 < offset) {
    fseek((FILE *)f->fp_,offset,0);
  }
  File::readLine_abi_cxx11_(&local_40,f);
  std::__cxx11::string::operator=((string *)&this->line,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

iterator(File& f, ssize_t offset) : f_(f), offset_(offset)
        {
            if (offset >= 0)
                f.seek(offset);
            line = f.readLine();
        }